

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLWriter.cpp
# Opt level: O0

Writer * __thiscall xe::xml::Writer::operator<<(Writer *this,EndElementType *param_1)

{
  size_type sVar1;
  ostream *poVar2;
  reference pvVar3;
  int local_1c;
  int i;
  EndElementType *param_1_local;
  Writer *this_local;
  
  if (this->m_state == STATE_ELEMENT) {
    std::operator<<(this->m_rawDst,"/>");
  }
  else {
    if (this->m_state == STATE_ELEMENT_END) {
      std::operator<<(this->m_rawDst,"\n");
      for (local_1c = 0;
          sVar1 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&this->m_elementStack), local_1c < (int)sVar1 + -1; local_1c = local_1c + 1
          ) {
        std::operator<<(this->m_rawDst,"  ");
      }
    }
    poVar2 = std::operator<<(this->m_rawDst,"</");
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back(&this->m_elementStack);
    poVar2 = std::operator<<(poVar2,(string *)pvVar3);
    std::operator<<(poVar2,">");
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back(&this->m_elementStack);
  this->m_state = STATE_ELEMENT_END;
  return this;
}

Assistant:

Writer& Writer::operator<< (const EndElementType&)
{
	if (m_state == STATE_ELEMENT)
		m_rawDst << "/>";
	else
	{
		if (m_state == STATE_ELEMENT_END)
		{
			m_rawDst << "\n";
			for (int i = 0; i < (int)m_elementStack.size()-1; i++)
				m_rawDst << "  ";
		}

		m_rawDst << "</" << m_elementStack.back() << ">";
	}

	m_elementStack.pop_back();
	m_state = STATE_ELEMENT_END;

	return *this;
}